

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O1

void pdf_init_document(hd_context *ctx,pdf_document *doc)

{
  byte bVar1;
  uint uVar2;
  uint i;
  hd_error_stack_slot *phVar3;
  int iVar4;
  uint uVar5;
  int64_t iVar6;
  size_t sVar7;
  pdf_xref_entry *ppVar8;
  pdf_obj *ppVar9;
  pdf_obj *ppVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  pdf_document *ppVar15;
  ulong uVar16;
  ulong uVar17;
  pdf_obj *dict;
  pdf_obj *nobj;
  undefined8 local_448;
  pdf_obj *local_440;
  pdf_obj *local_438 [129];
  
  local_448 = (pdf_obj *)0x0;
  hd_var_imp(&local_448);
  iVar4 = hd_push_try(ctx);
  if ((iVar4 == 0) || (iVar4 = __sigsetjmp(ctx->error->top->buffer,0), iVar4 != 0)) {
LAB_0010a346:
    phVar3 = ctx->error->top;
    ctx->error->top = phVar3 + -1;
    iVar4 = phVar3->code;
    if (1 < iVar4) {
      hd_rethrow_if(ctx,4);
      hd_warn(ctx,"trying to repair broken xref");
    }
    iVar12 = hd_push_try(ctx);
    if (((iVar12 != 0) && (iVar12 = __sigsetjmp(ctx->error->top->buffer,0), 1 < iVar4)) &&
       (iVar12 == 0)) {
      local_438[0] = (pdf_obj *)0x0;
      hd_var_imp(local_438);
      memset(doc->xref_index,0,(long)doc->max_xref_len << 2);
      ppVar15 = doc;
      pdf_repair_xref(ctx,doc);
      pdf_prime_xref_index((hd_context *)doc,ppVar15);
      uVar2 = doc->max_xref_len;
      pdf_repair_obj_stms(ctx,doc);
      if (doc->xref_sections == (pdf_xref *)0x0) {
        ppVar9 = (pdf_obj *)0x0;
      }
      else {
        ppVar9 = doc->xref_sections->trailer;
      }
      local_440 = pdf_dict_get(ctx,ppVar9,(pdf_obj *)0x12d);
      if (doc->xref_sections == (pdf_xref *)0x0) {
        ppVar9 = (pdf_obj *)0x0;
      }
      else {
        ppVar9 = doc->xref_sections->trailer;
      }
      ppVar9 = pdf_dict_get(ctx,ppVar9,(pdf_obj *)0xc1);
      if (1 < (int)uVar2) {
        uVar5 = 1;
        do {
          ppVar8 = pdf_get_xref_entry(ctx,doc,uVar5);
          if ((ppVar8->type != '\0') && (ppVar8->type != 'f')) {
            iVar4 = hd_push_try(ctx);
            if ((iVar4 != 0) && (iVar4 = __sigsetjmp(ctx->error->top->buffer,0), iVar4 == 0)) {
              local_448 = pdf_load_object(ctx,doc,uVar5);
            }
            phVar3 = ctx->error->top;
            ctx->error->top = phVar3 + -1;
            if (phVar3->code < 2) {
              if ((local_440 == (pdf_obj *)0x0) &&
                 ((ppVar10 = pdf_dict_get(ctx,local_448,(pdf_obj *)0x159),
                  ppVar10 == (pdf_obj *)0x46 ||
                  (((pdf_obj *)0x185 < ppVar10 &&
                   (iVar4 = pdf_objcmp_resolve(ctx,ppVar10,(pdf_obj *)0x46), iVar4 == 0)))))) {
                local_438[0] = pdf_new_indirect(ctx,doc,uVar5,0);
                if (doc->xref_sections == (pdf_xref *)0x0) {
                  ppVar10 = (pdf_obj *)0x0;
                }
                else {
                  ppVar10 = doc->xref_sections->trailer;
                }
                pdf_dict_put_drop(ctx,ppVar10,(pdf_obj *)0x12d,local_438[0]);
              }
              if ((ppVar9 == (pdf_obj *)0x0) &&
                 ((ppVar10 = pdf_dict_get(ctx,local_448,(pdf_obj *)0x55), ppVar10 != (pdf_obj *)0x0
                  || (ppVar10 = pdf_dict_get(ctx,local_448,(pdf_obj *)0x11d),
                     ppVar10 != (pdf_obj *)0x0)))) {
                local_438[0] = pdf_new_indirect(ctx,doc,uVar5,0);
                if (doc->xref_sections == (pdf_xref *)0x0) {
                  ppVar10 = (pdf_obj *)0x0;
                }
                else {
                  ppVar10 = doc->xref_sections->trailer;
                }
                pdf_dict_put_drop(ctx,ppVar10,(pdf_obj *)0xc1,local_438[0]);
              }
              pdf_drop_obj(ctx,local_448);
              local_448 = (pdf_obj *)0x0;
            }
            else {
              hd_rethrow_if(ctx,4);
              hd_warn(ctx,"ignoring broken object (%d 0 R)",(ulong)uVar5);
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
    phVar3 = ctx->error->top;
    ctx->error->top = phVar3 + -1;
    if (1 < phVar3->code) {
      if (local_448 != (pdf_obj *)0x0) {
        pdf_drop_obj(ctx,local_448);
      }
      hd_rethrow(ctx);
    }
    return;
  }
  hd_seek(ctx,doc->file,0,2);
  iVar6 = hd_tell(ctx,doc->file);
  lVar11 = (long)(int)iVar6;
  if (lVar11 < 0x401) {
    lVar11 = 0x400;
  }
  doc->file_size = (int)iVar6;
  hd_seek(ctx,doc->file,lVar11 + -0x400,0);
  sVar7 = hd_read(ctx,doc->file,(uchar *)local_438,0x400);
  if (8 < sVar7) {
    uVar17 = (long)&local_448 + 7;
    lVar11 = 0;
    do {
      if (*(char *)(uVar17 + 8 + sVar7) == 'f' && *(long *)(uVar17 + sVar7) == 0x6572787472617473) {
        uVar14 = sVar7 - lVar11;
        uVar16 = uVar14;
        if (uVar14 < sVar7) goto LAB_0010a205;
        goto LAB_0010a222;
      }
      lVar11 = lVar11 + 1;
      uVar17 = uVar17 - 1;
    } while (sVar7 - 8 != lVar11);
  }
  goto LAB_0010a1da;
  while( true ) {
    uVar14 = uVar14 + 1;
    lVar11 = lVar11 + -1;
    uVar16 = sVar7;
    if (lVar11 == 0) break;
LAB_0010a205:
    uVar17 = (ulong)*(byte *)((long)local_438 + uVar14);
    uVar16 = uVar14;
    if ((0x20 < uVar17) || ((0x100003601U >> (uVar17 & 0x3f) & 1) == 0)) break;
  }
LAB_0010a222:
  iVar4 = (int)uVar17;
  iVar12 = 0;
  if (uVar16 < sVar7) {
    iVar12 = 0;
    do {
      bVar1 = *(byte *)((long)local_438 + uVar16);
      uVar17 = CONCAT71((int7)(uVar17 >> 8),bVar1);
      iVar4 = (int)uVar17;
      if (9 < (byte)(bVar1 - 0x30)) break;
      if (iVar12 == 0x7fffffff) {
        doc->startxref = 0x7fffffff;
        pcVar13 = "startxref too large";
        goto LAB_0010a1e1;
      }
      uVar16 = uVar16 + 1;
      iVar12 = (uint)bVar1 + iVar12 * 10 + -0x30;
    } while (sVar7 != uVar16);
  }
  doc->startxref = iVar12;
  if (iVar12 != 0) {
    ppVar15 = doc;
    pdf_read_xref_sections(ctx,doc,(long)iVar12,&(doc->lexbuf).base,iVar4);
    if (doc->max_xref_len != 0) {
      pdf_prime_xref_index((hd_context *)doc,ppVar15);
      ppVar8 = pdf_get_xref_entry(ctx,doc,0);
      if (ppVar8->type != 'f') {
        if (ppVar8->type == '\0') {
          ppVar8->type = 'f';
          ppVar8->gen = 0xffff;
          ppVar8->num = 0;
        }
        else {
          hd_warn(ctx,"first object in xref is not free");
        }
      }
      uVar2 = doc->max_xref_len;
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          ppVar8 = pdf_get_xref_entry(ctx,doc,uVar5);
          if (ppVar8->type == 'n') {
            i = ppVar8->ofs;
            if (i == 0) {
              ppVar8->type = 'f';
            }
            else if (((int)i < 1) || (doc->file_size <= (int)i)) {
              pcVar13 = "object offset out of range: %d (%d 0 R)";
              goto LAB_0010a62d;
            }
          }
          if ((ppVar8->type == 'o') &&
             (((i = ppVar8->ofs, (int)i < 1 || ((int)uVar2 <= (int)i)) ||
              (ppVar8 = pdf_get_xref_entry(ctx,doc,i), ppVar8->type != 'n')))) {
            pcVar13 = "invalid reference to an objstm that does not exist: %d (%d 0 R)";
LAB_0010a62d:
            hd_throw(ctx,2,pcVar13,(ulong)i,(ulong)uVar5);
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      goto LAB_0010a346;
    }
    pcVar13 = "found xref was empty";
    goto LAB_0010a1e1;
  }
LAB_0010a1da:
  pcVar13 = "cannot find startxref";
LAB_0010a1e1:
  hd_throw(ctx,2,pcVar13);
}

Assistant:

static void
pdf_init_document(hd_context *ctx, pdf_document *doc)
{
	int repaired = 0;
    int i;

    pdf_obj *dict = NULL;
    hd_var(dict);

    hd_try(ctx)
    {
        pdf_load_xref(ctx, doc, &doc->lexbuf.base);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "trying to repair broken xref");
		repaired = 1;
    }

	hd_try(ctx)
	{
		if (repaired)
		{
            pdf_obj *obj;
            pdf_obj *nobj = NULL;
            hd_var(nobj);
			/*TODO:Some files are not at the bottom of the xref*/
			/* pdf_repair_xref may access xref_index, so reset it properly */
			memset(doc->xref_index, 0, sizeof(int) * doc->max_xref_len);
			pdf_repair_xref(ctx, doc);
            pdf_prime_xref_index(ctx, doc);


            int hasroot, hasinfo;

            int xref_len = pdf_xref_len(ctx, doc);
            pdf_repair_obj_stms(ctx, doc);

            hasroot = (pdf_dict_get(ctx, pdf_trailer(ctx, doc), PDF_NAME_Root) != NULL);
            hasinfo = (pdf_dict_get(ctx, pdf_trailer(ctx, doc), PDF_NAME_Info) != NULL);

            for (i = 1; i < xref_len; i++)
            {
                pdf_xref_entry *entry = pdf_get_xref_entry(ctx, doc, i);
                if (entry->type == 0 || entry->type == 'f')
                    continue;

                hd_try(ctx)
                {
                    dict = pdf_load_object(ctx, doc, i);
					/*if (dict == NULL)
						hd_throw(ctx, HD_ERROR_GENERIC, "ignoring broken object (%d 0 R)", i);*/
                }
                hd_catch(ctx)
                {
                    hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
                    hd_warn(ctx, "ignoring broken object (%d 0 R)", i);
                    continue;
                }

                if (!hasroot)
                {

                    obj = pdf_dict_get(ctx, dict, PDF_NAME_Type);
                    if (pdf_name_eq(ctx, obj, PDF_NAME_Catalog))
                    {
                        nobj = pdf_new_indirect(ctx, doc, i, 0);
                        pdf_dict_put_drop(ctx, pdf_trailer(ctx, doc), PDF_NAME_Root, nobj);
                    }
                }

                if (!hasinfo)
                {
                    if (pdf_dict_get(ctx, dict, PDF_NAME_Creator) || pdf_dict_get(ctx, dict, PDF_NAME_Producer))
                    {
                        nobj = pdf_new_indirect(ctx, doc, i, 0);
                        pdf_dict_put_drop(ctx, pdf_trailer(ctx, doc), PDF_NAME_Info, nobj);
                    }
                }

                pdf_drop_obj(ctx, dict);
                dict = NULL;
            }

		}
	}
	hd_catch(ctx)
	{
        if (dict != NULL)
            pdf_drop_obj(ctx, dict);
        hd_rethrow(ctx);
	}
}